

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QWellArray::setCurrent(QWellArray *this,int row,int col)

{
  int row_00;
  int column;
  undefined1 auVar1 [16];
  long in_FS_OFFSET;
  int local_40;
  int local_3c;
  QRect local_38;
  int *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  row_00 = this->curRow;
  column = this->curCol;
  if (column != col || row_00 != row) {
    if ((col | row) < 0) {
      col = -1;
      row = -1;
    }
    this->curRow = row;
    this->curCol = col;
    local_38 = cellGeometry(this,row_00,column);
    QWidget::update(&this->super_QWidget,&local_38);
    local_38 = cellGeometry(this,this->curRow,this->curCol);
    QWidget::update(&this->super_QWidget,&local_38);
    local_3c = this->curRow;
    local_40 = this->curCol;
    local_28 = &local_40;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &local_3c;
    local_38 = (QRect)(auVar1 << 0x40);
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWellArray::setCurrent(int row, int col)
{
    if ((curRow == row) && (curCol == col))
        return;

    if (row < 0 || col < 0)
        row = col = -1;

    int oldRow = curRow;
    int oldCol = curCol;

    curRow = row;
    curCol = col;

    updateCell(oldRow, oldCol);
    updateCell(curRow, curCol);

    emit currentChanged(curRow, curCol);
}